

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void registerInput(char *arg)

{
  optional<std::filesystem::__cxx11::path> *poVar1;
  enable_if_t<is_constructible_v<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path_&>,_std::filesystem::__cxx11::path_&>
  ppVar2;
  undefined8 extraout_RAX;
  optional<std::filesystem::__cxx11::path> *in_RSI;
  path *__p;
  int iVar3;
  char *in_RDI;
  char *pcStack_78;
  path pStack_70;
  char cStack_48;
  path pStack_40;
  char *local_8;
  
  if (options.input.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged) {
    registerInput();
  }
  else if (*in_RDI != '\0') {
    std::optional<std::filesystem::__cxx11::path>::emplace<char_const*&>(&options.input,&local_8);
    return;
  }
  iVar3 = (int)in_RDI;
  registerInput();
  if (iVar3 != 0) {
    cStack_48 = '\0';
    poVar1 = &options.input;
    if (_ZL12localOptions_5 != '\0') {
      poVar1 = &options.output;
    }
    if (((poVar1->super__Optional_base<std::filesystem::__cxx11::path,_false,_false>)._M_payload.
         super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
         super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged & 1U) == 0) {
      main::$_0::operator()();
      std::filesystem::__cxx11::path::~path(&pStack_40);
      if (cStack_48 == '\x01') {
        cStack_48 = '\0';
        std::filesystem::__cxx11::path::~path(&pStack_70);
      }
      _Unwind_Resume(extraout_RAX);
    }
    __p = (path *)&options.input;
    if (_ZL12localOptions_5 != '\0') {
      __p = (path *)&options.output;
    }
    std::filesystem::__cxx11::path::path(&pStack_70,__p);
    cStack_48 = '\x01';
    ppVar2 = std::optional<std::filesystem::__cxx11::path>::emplace<std::filesystem::__cxx11::path&>
                       (in_RSI,&pStack_70);
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&pStack_40,&pcStack_78,auto_format);
    std::filesystem::__cxx11::path::replace_extension(ppVar2);
    std::filesystem::__cxx11::path::~path(&pStack_40);
    if (cStack_48 == '\x01') {
      cStack_48 = 0;
      std::filesystem::__cxx11::path::~path(&pStack_70);
    }
  }
  return;
}

Assistant:

static void registerInput(char const *arg) {
	if (options.input.has_value()) {
		fprintf(stderr,
		        "FATAL: input image specified more than once! (first \"%s\", then "
		        "\"%s\")\n",
		        options.input->c_str(), arg);
		printUsage();
		exit(1);
	} else if (arg[0] == '\0') { // Empty input path
		fprintf(stderr, "FATAL: input image path cannot be empty\n");
		printUsage();
		exit(1);
	} else {
		options.input.emplace(arg);
	}
}